

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  int i;
  Printer *this_00;
  char *__s;
  Descriptor *pDVar1;
  ulong uVar2;
  FieldDescriptor *field;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint value;
  long lVar7;
  long lVar8;
  bool bVar9;
  allocator<char> local_b4;
  allocator_type local_b3;
  equal_to<const_google::protobuf::Descriptor_*> local_b2;
  hash<const_google::protobuf::Descriptor_*> local_b1;
  Printer *local_b0;
  char buffer [32];
  string local_78;
  Descriptor *local_58;
  string local_50;
  
  io::Printer::Print(printer,"bool $classname$::IsInitialized() const {\n","classname",
                     &this->classname_);
  local_b0 = printer;
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x2c)) {
    uVar3 = *(int *)(this->descriptor_ + 0x2c) + 0x1fU >> 5;
    if (uVar3 < 2) {
      uVar3 = 1;
    }
    lVar8 = 0x30;
    lVar7 = 0;
    uVar4 = 0;
    do {
      i = *(int *)(this->descriptor_ + 0x2c);
      value = 0;
      uVar2 = 0;
      lVar5 = lVar8;
      do {
        if ((long)(uVar2 + lVar7) < (long)i) {
          uVar6 = 1 << ((byte)uVar2 & 0x1f);
          if (*(int *)(*(long *)(this->descriptor_ + 0x30) + lVar5) != 2) {
            uVar6 = 0;
          }
          value = value | uVar6;
        }
        if ((long)i <= (long)(uVar2 + lVar7)) break;
        lVar5 = lVar5 + 0x78;
        bVar9 = uVar2 < 0x1f;
        uVar2 = uVar2 + 1;
      } while (bVar9);
      if (value != 0) {
        SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(uVar4 & 0xffffffff),i);
        __s = FastHex32ToBuffer(value,buffer);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_b4);
        io::Printer::Print(local_b0,"if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
                           "i",&local_78,"mask",&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      uVar4 = uVar4 + 1;
      lVar7 = lVar7 + 0x20;
      lVar8 = lVar8 + 0xf00;
    } while (uVar4 != uVar3);
  }
  io::Printer::Print(local_b0,"\n");
  pDVar1 = this->descriptor_;
  if (0 < *(int *)(pDVar1 + 0x2c)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar5 = *(long *)(pDVar1 + 0x30);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar5 + 0x2c + lVar7) * 4)
          == 10) {
        local_58 = *(Descriptor **)(lVar5 + 0x48 + lVar7);
        std::tr1::
        _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
        ::_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                      *)buffer,10,&local_b1,(_Mod_range_hashing *)&local_78,
                     (_Default_ranged_hash *)&local_50,&local_b2,
                     (_Identity<const_google::protobuf::Descriptor_*> *)&local_b4,&local_b3);
        bVar9 = anon_unknown_0::HasRequiredFields
                          (local_58,(hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
                                     *)buffer);
        std::tr1::
        _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
        ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                       *)buffer);
        if (bVar9) {
          if (*(int *)(lVar5 + 0x30 + lVar7) == 3) {
            FieldName_abi_cxx11_((string *)buffer,(cxx *)(lVar7 + lVar5),field);
            io::Printer::Print(local_b0,
                               "for (int i = 0; i < $name$_size(); i++) {\n  if (!this->$name$(i).IsInitialized()) return false;\n}\n"
                               ,"name",(string *)buffer);
          }
          else {
            FieldName_abi_cxx11_((string *)buffer,(cxx *)(lVar7 + lVar5),field);
            io::Printer::Print(local_b0,
                               "if (has_$name$()) {\n  if (!this->$name$().IsInitialized()) return false;\n}\n"
                               ,"name",(string *)buffer);
          }
          if ((char *)buffer._0_8_ != buffer + 0x10) {
            operator_delete((void *)buffer._0_8_,buffer._16_8_ + 1);
          }
        }
      }
      lVar8 = lVar8 + 1;
      pDVar1 = this->descriptor_;
      lVar7 = lVar7 + 0x78;
    } while (lVar8 < *(int *)(pDVar1 + 0x2c));
  }
  this_00 = local_b0;
  if (0 < *(int *)(pDVar1 + 0x58)) {
    io::Printer::Print(local_b0,"\nif (!_extensions_.IsInitialized()) return false;");
  }
  io::Printer::Outdent(this_00);
  io::Printer::Print(this_00,"  return true;\n}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
    "bool $classname$::IsInitialized() const {\n",
    "classname", classname_);
  printer->Indent();

  // Check that all required fields in this message are set.  We can do this
  // most efficiently by checking 32 "has bits" at a time.
  int has_bits_array_size = (descriptor_->field_count() + 31) / 32;
  for (int i = 0; i < has_bits_array_size; i++) {
    uint32 mask = 0;
    for (int bit = 0; bit < 32; bit++) {
      int index = i * 32 + bit;
      if (index >= descriptor_->field_count()) break;
      const FieldDescriptor* field = descriptor_->field(index);

      if (field->is_required()) {
        mask |= 1 << bit;
      }
    }

    if (mask != 0) {
      char buffer[kFastToBufferSize];
      printer->Print(
        "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
        "i", SimpleItoa(i),
        "mask", FastHex32ToBuffer(mask, buffer));
    }
  }

  // Now check that all embedded messages are initialized.
  printer->Print("\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field) &&
        HasRequiredFields(field->message_type())) {
      if (field->is_repeated()) {
        printer->Print(
          "for (int i = 0; i < $name$_size(); i++) {\n"
          "  if (!this->$name$(i).IsInitialized()) return false;\n"
          "}\n",
          "name", FieldName(field));
      } else {
        printer->Print(
          "if (has_$name$()) {\n"
          "  if (!this->$name$().IsInitialized()) return false;\n"
          "}\n",
          "name", FieldName(field));
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "\n"
      "if (!_extensions_.IsInitialized()) return false;");
  }

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}